

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_MXF.cpp
# Opt level: O2

void ASDCP::WriterInfoDump(WriterInfo *Info,FILE *stream)

{
  char *pcVar1;
  char *pcVar2;
  UUID local_78;
  char str_buf [40];
  
  if (stream == (FILE *)0x0) {
    stream = (FILE *)_stderr;
  }
  local_78.super_Identifier<16U>.m_HasValue = true;
  local_78.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)Info->ProductUUID;
  local_78.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(Info->ProductUUID + 8);
  local_78.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_00216010;
  pcVar1 = Kumu::UUID::EncodeHex(&local_78,str_buf,0x28);
  fprintf((FILE *)stream,"       ProductUUID: %s\n",pcVar1);
  pcVar2 = "No";
  pcVar1 = "No";
  if (Info->EncryptedEssence != false) {
    pcVar1 = "Yes";
  }
  fprintf((FILE *)stream,
          "    ProductVersion: %s\n       CompanyName: %s\n       ProductName: %s\n  EncryptedEssence: %s\n"
          ,(Info->ProductVersion)._M_dataplus._M_p,(Info->CompanyName)._M_dataplus._M_p,
          (Info->ProductName)._M_dataplus._M_p,pcVar1);
  if (Info->EncryptedEssence == true) {
    if (Info->UsesHMAC != false) {
      pcVar2 = "Yes";
    }
    fprintf((FILE *)stream,"              HMAC: %s\n",pcVar2);
    local_78.super_Identifier<16U>.m_HasValue = true;
    local_78.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)Info->ContextID;
    local_78.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(Info->ContextID + 8);
    local_78.super_Identifier<16U>.super_IArchive._vptr_IArchive =
         (_func_int **)&PTR__IArchive_00216010;
    pcVar1 = Kumu::UUID::EncodeHex(&local_78,str_buf,0x28);
    fprintf((FILE *)stream,"         ContextID: %s\n",pcVar1);
    local_78.super_Identifier<16U>.m_HasValue = true;
    local_78.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)Info->CryptographicKeyID;
    local_78.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(Info->CryptographicKeyID + 8);
    local_78.super_Identifier<16U>.super_IArchive._vptr_IArchive =
         (_func_int **)&PTR__IArchive_00216010;
    pcVar1 = Kumu::UUID::EncodeHex(&local_78,str_buf,0x28);
    fprintf((FILE *)stream,"CryptographicKeyID: %s\n",pcVar1);
  }
  local_78.super_Identifier<16U>.m_HasValue = true;
  local_78.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)Info->AssetUUID;
  local_78.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(Info->AssetUUID + 8);
  local_78.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_00216010;
  pcVar1 = Kumu::UUID::EncodeHex(&local_78,str_buf,0x28);
  fprintf((FILE *)stream,"         AssetUUID: %s\n",pcVar1);
  pcVar1 = "Unknown";
  if (Info->LabelSetType == LS_MXF_INTEROP) {
    pcVar1 = "MXF Interop";
  }
  pcVar2 = "SMPTE";
  if (Info->LabelSetType != LS_MXF_SMPTE) {
    pcVar2 = pcVar1;
  }
  fprintf((FILE *)stream,"    Label Set Type: %s\n",pcVar2);
  return;
}

Assistant:

void
ASDCP::WriterInfoDump(const WriterInfo& Info, FILE* stream)
{
  if ( stream == 0 )
    stream = stderr;

  char str_buf[40];

  fprintf(stream,"       ProductUUID: %s\n", UUID(Info.ProductUUID).EncodeHex(str_buf, 40));
  fprintf(stream,"\
    ProductVersion: %s\n\
       CompanyName: %s\n\
       ProductName: %s\n\
  EncryptedEssence: %s\n",
	  Info.ProductVersion.c_str(),
	  Info.CompanyName.c_str(),
	  Info.ProductName.c_str(),
	  ( Info.EncryptedEssence ? "Yes" : "No" )
	  );

  if ( Info.EncryptedEssence )
    {
      fprintf(stream, "              HMAC: %s\n", ( Info.UsesHMAC ? "Yes" : "No"));
      fprintf(stream, "         ContextID: %s\n", UUID(Info.ContextID).EncodeHex(str_buf, 40));
      fprintf(stream, "CryptographicKeyID: %s\n", UUID(Info.CryptographicKeyID).EncodeHex(str_buf, 40));
    }

  fprintf(stream,"         AssetUUID: %s\n", UUID(Info.AssetUUID).EncodeHex(str_buf, 40));
  fprintf(stream,"    Label Set Type: %s\n", ( Info.LabelSetType == LS_MXF_SMPTE ? "SMPTE" :
					       ( Info.LabelSetType == LS_MXF_INTEROP ? "MXF Interop" :
						 "Unknown" ) ));
}